

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_flushProduced
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,uint blockToFlush,ZSTD_EndDirective end)

{
  buffer_t *pbVar1;
  size_t *psVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  unsigned_long_long uVar7;
  ulong uVar8;
  ZSTDMT_jobDescription *pZVar9;
  ulong __n;
  ulong uVar10;
  bool bVar11;
  
  if (output->size < output->pos) {
    __assert_fail("output->size >= output->pos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x50ec,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  uVar6 = mtctx->jobIDMask & mtctx->doneJobID;
  pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar6].job_mutex);
  if ((blockToFlush != 0) && (mtctx->doneJobID < mtctx->nextJobID)) {
    if (mtctx->jobs[uVar6].cSize < mtctx->jobs[uVar6].dstFlushed) {
      __assert_fail("mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x50f1,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    pZVar9 = mtctx->jobs;
    if (pZVar9[uVar6].dstFlushed == pZVar9[uVar6].cSize) {
      do {
        pZVar9 = pZVar9 + uVar6;
        if (pZVar9->consumed == (pZVar9->src).size) break;
        pthread_cond_wait((pthread_cond_t *)&pZVar9->job_cond,(pthread_mutex_t *)&pZVar9->job_mutex)
        ;
        pZVar9 = mtctx->jobs;
      } while (pZVar9[uVar6].dstFlushed == pZVar9[uVar6].cSize);
    }
  }
  pZVar9 = mtctx->jobs + uVar6;
  uVar3 = pZVar9->consumed;
  uVar10 = pZVar9->cSize;
  uVar4 = (pZVar9->src).size;
  pthread_mutex_unlock((pthread_mutex_t *)&pZVar9->job_mutex);
  if (uVar10 < 0xffffffffffffff89) {
    if (uVar4 < uVar3) {
      __assert_fail("srcConsumed <= srcSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x510a,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if ((uVar3 == uVar4) && (pZVar9 = mtctx->jobs, pZVar9[uVar6].frameChecksumNeeded != 0)) {
      uVar7 = ZSTD_XXH64_digest(&(mtctx->serial).xxhState);
      *(int *)((long)pZVar9[uVar6].dstBuff.start + pZVar9[uVar6].cSize) = (int)uVar7;
      uVar10 = uVar10 + 4;
      pZVar9[uVar6].cSize = pZVar9[uVar6].cSize + 4;
      pZVar9[uVar6].frameChecksumNeeded = 0;
    }
    if (uVar10 != 0) {
      pZVar9 = mtctx->jobs;
      uVar8 = uVar10 - pZVar9[uVar6].dstFlushed;
      __n = output->size - output->pos;
      if (uVar8 < __n) {
        __n = uVar8;
      }
      if (mtctx->nextJobID <= mtctx->doneJobID) {
        __assert_fail("mtctx->doneJobID < mtctx->nextJobID",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5119,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (uVar10 < pZVar9[uVar6].dstFlushed) {
        __assert_fail("cSize >= mtctx->jobs[wJobID].dstFlushed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x511a,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      pvVar5 = pZVar9[uVar6].dstBuff.start;
      if (pvVar5 == (void *)0x0) {
        __assert_fail("mtctx->jobs[wJobID].dstBuff.start != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x511b,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (__n != 0) {
        memcpy((void *)(output->pos + (long)output->dst),
               (void *)((long)pvVar5 + pZVar9[uVar6].dstFlushed),__n);
      }
      output->pos = output->pos + __n;
      pZVar9 = mtctx->jobs;
      pZVar9[uVar6].dstFlushed = pZVar9[uVar6].dstFlushed + __n;
      if ((uVar3 == uVar4) && (pZVar9[uVar6].dstFlushed == uVar10)) {
        ZSTDMT_releaseBuffer(mtctx->bufPool,pZVar9[uVar6].dstBuff);
        pbVar1 = &mtctx->jobs[uVar6].dstBuff;
        pbVar1->start = (void *)0x0;
        pbVar1->capacity = 0;
        mtctx->jobs[uVar6].cSize = 0;
        mtctx->consumed = mtctx->consumed + uVar4;
        mtctx->produced = mtctx->produced + uVar10;
        mtctx->doneJobID = mtctx->doneJobID + 1;
      }
    }
    psVar2 = &mtctx->jobs[uVar6].dstFlushed;
    bVar11 = uVar10 < *psVar2;
    uVar10 = uVar10 - *psVar2;
    if (bVar11 || uVar10 == 0) {
      bVar11 = uVar4 <= uVar3;
      uVar10 = 1;
      goto LAB_0015b782;
    }
  }
  else {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
  }
  bVar11 = false;
LAB_0015b782:
  if ((((bVar11) && (uVar10 = 1, mtctx->nextJobID <= mtctx->doneJobID)) && (mtctx->jobReady == 0))
     && ((mtctx->inBuff).filled == 0)) {
    mtctx->allJobsCompleted = mtctx->frameEnded;
    if (end == ZSTD_e_end) {
      uVar10 = (ulong)(mtctx->frameEnded == 0);
    }
    else {
      uVar10 = 0;
    }
  }
  return uVar10;
}

Assistant:

static size_t ZSTDMT_flushProduced(ZSTDMT_CCtx* mtctx, ZSTD_outBuffer* output, unsigned blockToFlush, ZSTD_EndDirective end)
{
    unsigned const wJobID = mtctx->doneJobID & mtctx->jobIDMask;
    DEBUGLOG(5, "ZSTDMT_flushProduced (blocking:%u , job %u <= %u)",
                blockToFlush, mtctx->doneJobID, mtctx->nextJobID);
    assert(output->size >= output->pos);

    ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[wJobID].job_mutex);
    if (  blockToFlush
      && (mtctx->doneJobID < mtctx->nextJobID) ) {
        assert(mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize);
        while (mtctx->jobs[wJobID].dstFlushed == mtctx->jobs[wJobID].cSize) {  /* nothing to flush */
            if (mtctx->jobs[wJobID].consumed == mtctx->jobs[wJobID].src.size) {
                DEBUGLOG(5, "job %u is completely consumed (%u == %u) => don't wait for cond, there will be none",
                            mtctx->doneJobID, (U32)mtctx->jobs[wJobID].consumed, (U32)mtctx->jobs[wJobID].src.size);
                break;
            }
            DEBUGLOG(5, "waiting for something to flush from job %u (currently flushed: %u bytes)",
                        mtctx->doneJobID, (U32)mtctx->jobs[wJobID].dstFlushed);
            ZSTD_pthread_cond_wait(&mtctx->jobs[wJobID].job_cond, &mtctx->jobs[wJobID].job_mutex);  /* block when nothing to flush but some to come */
    }   }

    /* try to flush something */
    {   size_t cSize = mtctx->jobs[wJobID].cSize;                  /* shared */
        size_t const srcConsumed = mtctx->jobs[wJobID].consumed;   /* shared */
        size_t const srcSize = mtctx->jobs[wJobID].src.size;       /* read-only, could be done after mutex lock, but no-declaration-after-statement */
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        if (ZSTD_isError(cSize)) {
            DEBUGLOG(5, "ZSTDMT_flushProduced: job %u : compression error detected : %s",
                        mtctx->doneJobID, ZSTD_getErrorName(cSize));
            ZSTDMT_waitForAllJobsCompleted(mtctx);
            ZSTDMT_releaseAllJobResources(mtctx);
            return cSize;
        }
        /* add frame checksum if necessary (can only happen once) */
        assert(srcConsumed <= srcSize);
        if ( (srcConsumed == srcSize)   /* job completed -> worker no longer active */
          && mtctx->jobs[wJobID].frameChecksumNeeded ) {
            U32 const checksum = (U32)XXH64_digest(&mtctx->serial.xxhState);
            DEBUGLOG(4, "ZSTDMT_flushProduced: writing checksum : %08X \n", checksum);
            MEM_writeLE32((char*)mtctx->jobs[wJobID].dstBuff.start + mtctx->jobs[wJobID].cSize, checksum);
            cSize += 4;
            mtctx->jobs[wJobID].cSize += 4;  /* can write this shared value, as worker is no longer active */
            mtctx->jobs[wJobID].frameChecksumNeeded = 0;
        }

        if (cSize > 0) {   /* compression is ongoing or completed */
            size_t const toFlush = MIN(cSize - mtctx->jobs[wJobID].dstFlushed, output->size - output->pos);
            DEBUGLOG(5, "ZSTDMT_flushProduced: Flushing %u bytes from job %u (completion:%u/%u, generated:%u)",
                        (U32)toFlush, mtctx->doneJobID, (U32)srcConsumed, (U32)srcSize, (U32)cSize);
            assert(mtctx->doneJobID < mtctx->nextJobID);
            assert(cSize >= mtctx->jobs[wJobID].dstFlushed);
            assert(mtctx->jobs[wJobID].dstBuff.start != NULL);
            if (toFlush > 0) {
                memcpy((char*)output->dst + output->pos,
                    (const char*)mtctx->jobs[wJobID].dstBuff.start + mtctx->jobs[wJobID].dstFlushed,
                    toFlush);
            }
            output->pos += toFlush;
            mtctx->jobs[wJobID].dstFlushed += toFlush;  /* can write : this value is only used by mtctx */

            if ( (srcConsumed == srcSize)    /* job is completed */
              && (mtctx->jobs[wJobID].dstFlushed == cSize) ) {   /* output buffer fully flushed => free this job position */
                DEBUGLOG(5, "Job %u completed (%u bytes), moving to next one",
                        mtctx->doneJobID, (U32)mtctx->jobs[wJobID].dstFlushed);
                ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[wJobID].dstBuff);
                DEBUGLOG(5, "dstBuffer released");
                mtctx->jobs[wJobID].dstBuff = g_nullBuffer;
                mtctx->jobs[wJobID].cSize = 0;   /* ensure this job slot is considered "not started" in future check */
                mtctx->consumed += srcSize;
                mtctx->produced += cSize;
                mtctx->doneJobID++;
        }   }

        /* return value : how many bytes left in buffer ; fake it to 1 when unknown but >0 */
        if (cSize > mtctx->jobs[wJobID].dstFlushed) return (cSize - mtctx->jobs[wJobID].dstFlushed);
        if (srcSize > srcConsumed) return 1;   /* current job not completely compressed */
    }
    if (mtctx->doneJobID < mtctx->nextJobID) return 1;   /* some more jobs ongoing */
    if (mtctx->jobReady) return 1;      /* one job is ready to push, just not yet in the list */
    if (mtctx->inBuff.filled > 0) return 1;   /* input is not empty, and still needs to be converted into a job */
    mtctx->allJobsCompleted = mtctx->frameEnded;   /* all jobs are entirely flushed => if this one is last one, frame is completed */
    if (end == ZSTD_e_end) return !mtctx->frameEnded;  /* for ZSTD_e_end, question becomes : is frame completed ? instead of : are internal buffers fully flushed ? */
    return 0;   /* internal buffers fully flushed */
}